

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray-bmp.hxx
# Opt level: O0

uint8_t * andres::bmp::fileHeader(uint32_t height,uint32_t stride)

{
  int iVar1;
  uint32_t offset;
  uint32_t fileSize;
  uint32_t stride_local;
  uint32_t height_local;
  
  iVar1 = stride * height + 0x436;
  fileHeader::fileHeader[0] = 'B';
  fileHeader::fileHeader[1] = 'M';
  fileHeader::fileHeader[2] = (uint8_t)iVar1;
  fileHeader::fileHeader[3] = (uint8_t)((uint)iVar1 >> 8);
  fileHeader::fileHeader[4] = (uint8_t)((uint)iVar1 >> 0x10);
  fileHeader::fileHeader[5] = (uint8_t)((uint)iVar1 >> 0x18);
  fileHeader::fileHeader[10] = '6';
  fileHeader::fileHeader[0xb] = '\x04';
  fileHeader::fileHeader[0xc] = '\0';
  fileHeader::fileHeader[0xd] = '\0';
  return fileHeader::fileHeader;
}

Assistant:

std::uint8_t*
fileHeader(
    std::uint32_t const height,
    std::uint32_t const stride
) {
    std::uint32_t const fileSize = FILE_HEADER_SIZE + INFO_HEADER_SIZE + COLOR_TABLE_SIZE + (stride * height);
    std::uint32_t const offset = FILE_HEADER_SIZE + INFO_HEADER_SIZE + COLOR_TABLE_SIZE;

    static std::uint8_t fileHeader[] = {
        0,0,     /// signature
        0,0,0,0, /// image file size in bytes
        0,0,0,0, /// reserved, should be 0
        0,0,0,0, /// start of pixel array
    };

    fileHeader[ 0] = static_cast<std::uint8_t>('B');
    fileHeader[ 1] = static_cast<std::uint8_t>('M');
    fileHeader[ 2] = static_cast<std::uint8_t>(fileSize      );
    fileHeader[ 3] = static_cast<std::uint8_t>(fileSize >>  8);
    fileHeader[ 4] = static_cast<std::uint8_t>(fileSize >> 16);
    fileHeader[ 5] = static_cast<std::uint8_t>(fileSize >> 24);
    fileHeader[10] = static_cast<std::uint8_t>(offset);
    fileHeader[11] = static_cast<std::uint8_t>(offset >> 8);
    fileHeader[12] = static_cast<std::uint8_t>(offset >> 16);
    fileHeader[13] = static_cast<std::uint8_t>(offset >> 24);

    return fileHeader;
}